

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::operator=
          (accessor<pybind11::detail::accessor_policies::generic_item> *this,
          accessor<pybind11::detail::accessor_policies::generic_item> *value)

{
  handle obj;
  handle key;
  handle local_20;
  
  obj.m_ptr = (this->obj).m_ptr;
  key.m_ptr = (this->key).super_handle.m_ptr;
  accessor::operator_cast_to_object((accessor *)&local_20);
  accessor_policies::generic_item::set(obj,key,local_20);
  pybind11::object::~object((object *)&local_20);
  return;
}

Assistant:

void operator=(T &&value) && {
        Policy::set(obj, key, object_or_cast(std::forward<T>(value)));
    }